

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.h
# Opt level: O1

void Message<char_const*,unsigned_char&,int&,char_const*>
               (MsgType type,char *pcsz_,char **args,uchar *args_1,int *args_2,char **args_3)

{
  iterator iVar1;
  LogHelper *pLVar2;
  exception *this;
  string msg;
  char local_31;
  string local_30;
  
  util::fmt_abi_cxx11_(&local_30,pcsz_,*args,(ulong)*args_1,(ulong)(uint)*args_2,*args_3);
  if (type != msgStatus) {
    if (type == msgError) {
      this = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<std::__cxx11::string&>(this,&local_30);
      __cxa_throw(this,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&seen_messages_abi_cxx11_._M_t,&local_30);
    if ((_Rb_tree_header *)iVar1._M_node !=
        &seen_messages_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) goto LAB_00140d0a;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&seen_messages_abi_cxx11_,&local_30);
    switch(type) {
    case msgStatus:
      goto switchD_00140c46_caseD_0;
    case msgInfo:
      util::operator<<((LogHelper *)&util::cout,(char (*) [7])"Info: ");
      break;
    case msgFix:
      pLVar2 = util::operator<<((LogHelper *)&util::cout,GREEN);
      util::operator<<(pLVar2,(char (*) [8])"Fixed: ");
      break;
    case msgWarning:
      pLVar2 = util::operator<<((LogHelper *)&util::cout,YELLOW);
      util::operator<<(pLVar2,(char (*) [10])"Warning: ");
      break;
    default:
      goto switchD_00140c46_default;
    }
    if (type != msgStatus) {
switchD_00140c46_default:
      pLVar2 = util::operator<<((LogHelper *)&util::cout,&local_30);
      pLVar2 = util::operator<<(pLVar2,none);
      local_31 = '\n';
      util::operator<<(pLVar2,&local_31);
      goto LAB_00140d0a;
    }
  }
switchD_00140c46_caseD_0:
  pLVar2 = util::operator<<((LogHelper *)&util::cout,statusbegin);
  pLVar2 = util::operator<<(pLVar2,(char (*) [2])0x1aee63);
  pLVar2 = util::operator<<(pLVar2,&local_30);
  util::operator<<(pLVar2,statusend);
LAB_00140d0a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Message(MsgType type, const char* pcsz_, Args&& ...args)
{
    std::string msg = util::fmt(pcsz_, std::forward<Args>(args)...);

    if (type == msgError)
        throw util::exception(msg);

    if (type != msgStatus)
    {
        if (seen_messages.find(msg) != seen_messages.end())
            return;

        seen_messages.insert(msg);
    }

    switch (type)
    {
    case msgStatus:  break;
    case msgInfo:    util::cout << "Info: "; break;
    case msgFix:     util::cout << colour::GREEN << "Fixed: "; break;
    case msgWarning: util::cout << colour::YELLOW << "Warning: "; break;
    case msgError:   util::cout << colour::RED << "Error: "; break;
    }

    if (type == msgStatus)
        util::cout << ttycmd::statusbegin << "\r" << msg << ttycmd::statusend;
    else
        util::cout << msg << colour::none << '\n';
}